

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  Curl_easy *pCVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  int *piVar11;
  uint *puVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  ushort uVar16;
  undefined4 uVar17;
  socklen_t __len;
  if2ip_result_t iVar18;
  byte *__s;
  curltime cVar19;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  int optval;
  long port;
  curl_socklen_t size;
  curl_socklen_t onoff;
  char ipaddress [46];
  char buffer [128];
  Curl_sockaddr_ex addr;
  char buffer_1 [128];
  uint local_344;
  char *local_340;
  undefined4 local_338;
  uint local_334;
  byte *local_330;
  Curl_easy *local_328;
  long local_320;
  Curl_dns_entry *local_318;
  undefined4 local_30c;
  long local_308;
  socklen_t local_2fc;
  sockaddr local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  char local_278 [48];
  sockaddr local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_148 [144];
  char local_b8 [136];
  
  pCVar2 = conn->data;
  local_30c = 1;
  *sockp = -1;
  CVar5 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)local_148,(curl_socket_t *)&local_344);
  if (CVar5 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var4 = getaddressinfo((sockaddr *)(local_148 + 0x10),local_278,&local_308);
  if (!_Var4) {
    puVar12 = (uint *)__errno_location();
    uVar14 = *puVar12;
    pcVar15 = Curl_strerror(uVar14,(char *)&local_248,0x80);
    Curl_failf(pCVar2,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar14,pcVar15);
    Curl_closesocket(conn,local_344);
    return CURLE_OK;
  }
  Curl_infof(pCVar2,"  Trying %s:%ld...\n",local_278,local_308);
  if (((local_148._0_4_ & 0xfffffff7) == 2) && (local_148._4_4_ == 1)) {
    uVar8 = *(ulong *)&(pCVar2->set).field_0x878;
    if ((uVar8 >> 0x23 & 1) != 0) {
      pCVar3 = conn->data;
      local_2f8._0_4_ = 1;
      iVar6 = setsockopt(local_344,6,1,&local_2f8,4);
      if (iVar6 < 0) {
        piVar11 = __errno_location();
        pcVar15 = Curl_strerror(*piVar11,(char *)&local_248,0x80);
        Curl_infof(pCVar3,"Could not set TCP_NODELAY: %s\n",pcVar15);
      }
      else {
        Curl_infof(pCVar3,"TCP_NODELAY set\n");
      }
      uVar8 = *(ulong *)&(pCVar2->set).field_0x878;
    }
    uVar14 = local_344;
    if ((uVar8 >> 0x2b & 1) != 0) {
      local_248._0_4_ = 1;
      iVar6 = setsockopt(local_344,1,9,&local_248,4);
      if (iVar6 < 0) {
        pcVar15 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar6 = curlx_sltosi((pCVar2->set).tcp_keepidle);
        local_248._0_4_ = iVar6;
        iVar6 = setsockopt(uVar14,6,4,&local_248,4);
        if (iVar6 < 0) {
          Curl_infof(pCVar2,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)uVar14);
        }
        iVar6 = curlx_sltosi((pCVar2->set).tcp_keepintvl);
        local_248._0_4_ = iVar6;
        iVar6 = setsockopt(uVar14,6,5,&local_248,4);
        if (-1 < iVar6) goto LAB_0054f635;
        pcVar15 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(pCVar2,pcVar15,(ulong)uVar14);
    }
  }
LAB_0054f635:
  uVar14 = local_344;
  if ((pCVar2->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_0054f687:
    uVar17 = 0;
  }
  else {
    Curl_set_in_callback(pCVar2,true);
    uVar14 = local_344;
    iVar6 = (*(pCVar2->set).fsockopt)((pCVar2->set).sockopt_client,local_344,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(pCVar2,false);
    if (iVar6 == 0) goto LAB_0054f687;
    if (iVar6 != 2) {
      Curl_closesocket(conn,uVar14);
      return CURLE_ABORTED_BY_CALLBACK;
    }
    uVar17 = 1;
  }
  if ((local_148._0_4_ & 0xfffffff7) != 2) goto LAB_0054fb46;
  local_340 = (char *)CONCAT44(local_340._4_4_,local_148._0_4_);
  local_338 = uVar17;
  uVar7 = Curl_ipv6_scope((sockaddr *)(local_148 + 0x10));
  pCVar3 = conn->data;
  local_318 = (Curl_dns_entry *)0x0;
  uVar16 = (pCVar3->set).localport;
  __s = (byte *)(pCVar3->set).str[8];
  uVar17 = local_338;
  if (uVar16 == 0 && __s == (byte *)0x0) goto LAB_0054fb46;
  local_330 = (byte *)CONCAT44(local_330._4_4_,uVar7);
  iVar6 = (pCVar3->set).localportrange;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8.sa_family = 0;
  local_2f8.sa_data[0] = '\0';
  local_2f8.sa_data[1] = '\0';
  local_2f8.sa_data[2] = '\0';
  local_2f8.sa_data[3] = '\0';
  local_2f8.sa_data[4] = '\0';
  local_2f8.sa_data[5] = '\0';
  local_2f8.sa_data[6] = '\0';
  local_2f8.sa_data[7] = '\0';
  local_2f8.sa_data[8] = '\0';
  local_2f8.sa_data[9] = '\0';
  local_2f8.sa_data[10] = '\0';
  local_2f8.sa_data[0xb] = '\0';
  local_2f8.sa_data[0xc] = '\0';
  local_2f8.sa_data[0xd] = '\0';
  local_334 = uVar14;
  local_328 = pCVar3;
  if ((__s == (byte *)0x0) || (sVar9 = strlen((char *)__s), 0xfe < sVar9)) {
    if ((int)local_340 == 2) {
LAB_0054fa01:
      local_2f8.sa_data._0_2_ = uVar16 << 8 | uVar16 >> 8;
      local_2f8.sa_family = 2;
      __len = 0x10;
    }
    else {
      __len = 0;
      if ((int)local_340 == 10) {
        local_2f8.sa_data._0_2_ = uVar16 << 8 | uVar16 >> 8;
        local_2f8.sa_family = 10;
        __len = 0x1c;
      }
    }
LAB_0054fa23:
    while (iVar13 = bind(local_334,&local_2f8,__len), iVar13 < 0) {
      if (iVar6 < 2) {
        puVar12 = (uint *)__errno_location();
        pCVar2 = local_328;
        uVar14 = *puVar12;
        (local_328->state).os_errno = uVar14;
        pcVar15 = Curl_strerror(uVar14,(char *)&local_248,0x80);
        Curl_failf(pCVar2,"bind failed with errno %d: %s",(ulong)uVar14,pcVar15);
        Curl_closesocket(conn,local_344);
        return CURLE_INTERFACE_FAILED;
      }
      iVar6 = iVar6 + -1;
      Curl_infof(local_328,"Bind to local port %hu failed, trying next\n",(ulong)uVar16);
      uVar16 = uVar16 + 1;
      local_2f8.sa_data._0_2_ = uVar16 * 0x100 | uVar16 >> 8;
    }
    local_2fc = 0x80;
    local_248.sa_family = 0;
    local_248.sa_data[0] = '\0';
    local_248.sa_data[1] = '\0';
    local_248.sa_data[2] = '\0';
    local_248.sa_data[3] = '\0';
    local_248.sa_data[4] = '\0';
    local_248.sa_data[5] = '\0';
    local_248.sa_data[6] = '\0';
    local_248.sa_data[7] = '\0';
    local_248.sa_data[8] = '\0';
    local_248.sa_data[9] = '\0';
    local_248.sa_data[10] = '\0';
    local_248.sa_data[0xb] = '\0';
    local_248.sa_data[0xc] = '\0';
    local_248.sa_data[0xd] = '\0';
    local_238 = 0;
    uStack_230 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_218 = 0;
    uStack_210 = 0;
    local_208 = 0;
    uStack_200 = 0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1d8 = 0;
    uStack_1d0 = 0;
    iVar6 = getsockname(local_334,&local_248,&local_2fc);
    if (iVar6 < 0) {
      puVar12 = (uint *)__errno_location();
      pCVar3 = local_328;
      uVar14 = *puVar12;
      (local_328->state).os_errno = uVar14;
      pcVar15 = Curl_strerror(uVar14,local_b8,0x80);
      Curl_failf(pCVar3,"getsockname() failed with errno %d: %s",(ulong)uVar14,pcVar15);
      goto LAB_0054fb0e;
    }
    iVar18 = IF2IP_NOT_FOUND;
    Curl_infof(local_328,"Local port: %hu\n",(ulong)uVar16);
    puVar1 = &(conn->bits).field_0x7;
    *puVar1 = *puVar1 | 1;
  }
  else {
    memset(&local_248,0,0x100);
    iVar13 = *__s - 0x69;
    if ((iVar13 == 0) && (iVar13 = __s[1] - 0x66, iVar13 == 0)) {
      iVar13 = 0x21 - (uint)__s[2];
    }
    else {
      iVar13 = -iVar13;
    }
    local_320 = CONCAT44(local_320._4_4_,iVar13);
    if (iVar13 != 0) {
      iVar13 = strncmp("host!",(char *)__s,5);
      if (iVar13 != 0) goto LAB_0054f801;
      local_330 = __s + 5;
      goto LAB_0054f8c5;
    }
    __s = __s + 3;
LAB_0054f801:
    sVar9 = strlen((char *)__s);
    iVar13 = setsockopt(local_334,1,0x19,__s,(int)sVar9 + 1);
    if (iVar13 == 0) {
      iVar18 = IF2IP_NOT_FOUND;
      goto LAB_0054fb14;
    }
    uVar14 = (uint)local_330;
    local_330 = __s;
    iVar18 = Curl_if2ip((int)local_340,uVar14,conn->scope_id,(char *)__s,(char *)&local_248,0x100);
    if (iVar18 == IF2IP_FOUND) {
      Curl_infof(local_328,"Local Interface %s is ip %s using address family %i\n",local_330,
                 &local_248,(ulong)local_340 & 0xffffffff);
LAB_0054f97c:
      __len = 0;
      if ((int)local_340 == 2) {
        iVar13 = inet_pton(2,(char *)&local_248,local_2f8.sa_data + 2);
        if (0 < iVar13) goto LAB_0054fa01;
      }
      else {
        __len = 0;
        if ((int)local_340 == 10) {
          pcVar15 = strchr((char *)&local_248,0x25);
          if (pcVar15 == (char *)0x0) {
            local_340 = (char *)0x0;
          }
          else {
            local_340 = pcVar15 + 1;
            *pcVar15 = '\0';
          }
          iVar13 = inet_pton(10,(char *)&local_248,local_2f8.sa_data + 6);
          __len = 0x1c;
          if (0 < iVar13) {
            local_2f8.sa_data._0_2_ = uVar16 << 8 | uVar16 >> 8;
            local_2f8.sa_family = 10;
            if (local_340 != (char *)0x0) {
              iVar13 = atoi(local_340);
              uStack_2e0 = CONCAT44(uStack_2e0._4_4_,iVar13);
            }
          }
        }
      }
      goto LAB_0054fa23;
    }
    if (iVar18 == IF2IP_AF_NOT_SUPPORTED) goto LAB_0054fb14;
    if (iVar18 == IF2IP_NOT_FOUND) {
      if ((int)local_320 != 0) {
LAB_0054f8c5:
        local_320 = conn->ip_version;
        if ((int)local_340 == 2) {
          lVar10 = 1;
LAB_0054f8eb:
          conn->ip_version = lVar10;
        }
        else if ((int)local_340 == 10) {
          lVar10 = 2;
          goto LAB_0054f8eb;
        }
        Curl_resolv(conn,(char *)local_330,0,false,&local_318);
        conn->ip_version = local_320;
        if (local_318 != (Curl_dns_entry *)0x0) {
          Curl_printable_address(local_318->addr,(char *)&local_248,0x100);
          pCVar3 = local_328;
          Curl_infof(local_328,"Name \'%s\' family %i resolved to \'%s\' family %i\n",local_330,
                     (ulong)local_340 & 0xffffffff,&local_248,
                     (ulong)(uint)local_318->addr->ai_family);
          Curl_resolv_unlock(pCVar3,local_318);
          goto LAB_0054f97c;
        }
        goto LAB_0054f9c9;
      }
      pcVar15 = "Couldn\'t bind to interface \'%s\'";
    }
    else {
      if ((int)local_320 != 0) goto LAB_0054f8c5;
LAB_0054f9c9:
      puVar1 = &(local_328->state).field_0x4e4;
      *puVar1 = *puVar1 & 0xf7;
      pcVar15 = "Couldn\'t bind to \'%s\'";
    }
    Curl_failf(local_328,pcVar15,local_330);
LAB_0054fb0e:
    iVar18 = 0x2d;
  }
LAB_0054fb14:
  uVar14 = local_344;
  uVar17 = local_338;
  if (iVar18 != IF2IP_NOT_FOUND) {
    Curl_closesocket(conn,local_344);
    if (iVar18 == IF2IP_AF_NOT_SUPPORTED) {
      return CURLE_COULDNT_CONNECT;
    }
    return iVar18;
  }
LAB_0054fb46:
  curlx_nonblock(uVar14,1);
  cVar19 = Curl_now();
  (conn->connecttime).tv_sec = cVar19.tv_sec;
  (conn->connecttime).tv_usec = cVar19.tv_usec;
  if (1 < conn->num_addr) {
    Curl_expire(pCVar2,conn->timeoutms_per_addr,EXPIRE_DNS_PER_NAME);
  }
  if (((char)uVar17 == '\0') && (conn->socktype == 1)) {
    if (((conn->bits).field_0x7 & 8) != 0) {
      iVar6 = setsockopt(uVar14,6,0x1e,&local_30c,4);
      if (iVar6 < 0) {
        Curl_infof(pCVar2,"Failed to enable TCP Fast Open on fd %d\n",(ulong)uVar14);
      }
      else {
        Curl_infof(pCVar2,"TCP_FASTOPEN_CONNECT set\n");
      }
    }
    iVar6 = connect(uVar14,(sockaddr *)(local_148 + 0x10),local_148._12_4_);
    if (iVar6 == -1) {
      piVar11 = __errno_location();
      iVar6 = *piVar11;
      if ((iVar6 != 0xb) && (iVar6 != 0x73)) {
        pcVar15 = Curl_strerror(iVar6,(char *)&local_248,0x80);
        Curl_infof(pCVar2,"Immediate connect fail for %s: %s\n",local_278,pcVar15);
        (pCVar2->state).os_errno = iVar6;
        Curl_closesocket(conn,uVar14);
        return CURLE_COULDNT_CONNECT;
      }
    }
  }
  *sockp = uVar14;
  return CURLE_OK;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif
  char buffer[STRERROR_LEN];

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s:%ld...\n", ipaddress, port);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1)
    Curl_expire(data, conn->timeoutms_per_addr, EXPIRE_DNS_PER_NAME);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d\n", sockfd);
      else
        infof(data, "TCP_FASTOPEN_CONNECT set\n");

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(error, buffer, sizeof(buffer)));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}